

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

int __thiscall capnp::_::ListBuilder::getDataElement<int>(ListBuilder *this,ElementCount index)

{
  byte *pbVar1;
  int iVar2;
  unsigned_long uVar3;
  ElementCount index_local;
  ListBuilder *this_local;
  
  pbVar1 = this->ptr;
  uVar3 = upgradeBound<unsigned_long,unsigned_int>(index);
  iVar2 = DirectWireValue<int>::get((DirectWireValue<int> *)(pbVar1 + (uVar3 * this->step >> 3)));
  return iVar2;
}

Assistant:

inline T ListBuilder::getDataElement(ElementCount index) {
  return reinterpret_cast<WireValue<T>*>(
      ptr + upgradeBound<uint64_t>(index) * step / BITS_PER_BYTE)->get();

  // TODO(perf):  Benchmark this alternate implementation, which I suspect may make better use of
  //   the x86 SIB byte.  Also use it for all the other getData/setData implementations below, and
  //   the various non-inline methods that look up pointers.
  //   Also if using this, consider changing ptr back to void* instead of byte*.
//  return reinterpret_cast<WireValue<T>*>(ptr)[
//      index / ELEMENTS * (step / capnp::bitsPerElement<T>())].get();
}